

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::checkNextPragmaToken(Preprocessor *this)

{
  bool bVar1;
  SourceLocation SVar2;
  SimplePragmaExpressionSyntax *pSVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  string_view sVar5;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar6;
  Token expected;
  
  bVar1 = peekSameLine(this);
  if (bVar1) {
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    pSVar3 = (SimplePragmaExpressionSyntax *)0x0;
  }
  else {
    SVar2 = Token::location(&this->lastConsumed);
    sVar5 = Token::rawText(&this->lastConsumed);
    SVar2 = (SourceLocation)((long)SVar2 + sVar5._M_len * 0x10000000);
    addDiag(this,(DiagCode)0x80004,SVar2);
    expected = Token::createMissing(this->alloc,Identifier,SVar2);
    pSVar3 = BumpAllocator::
             emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                       (this->alloc,&expected);
    uVar4 = 0;
  }
  pVar6._8_8_ = uVar4;
  pVar6.first = &pSVar3->super_PragmaExpressionSyntax;
  return pVar6;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::checkNextPragmaToken() {
    if (!peekSameLine()) {
        auto loc = lastConsumed.location() + lastConsumed.rawText().length();
        addDiag(diag::ExpectedPragmaExpression, loc);

        auto expected = Token::createMissing(alloc, TokenKind::Identifier, loc);
        return {alloc.emplace<SimplePragmaExpressionSyntax>(expected), false};
    }
    return {nullptr, true};
}